

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O2

void __thiscall
icu_63::DateFormatSymbols::setAmPmStrings
          (DateFormatSymbols *this,UnicodeString *amPmsArray,int32_t count)

{
  UnicodeString *pUVar1;
  UnicodeString *p;
  long lVar2;
  
  pUVar1 = this->fAmPms;
  if (pUVar1 != (UnicodeString *)0x0) {
    lVar2 = *(long *)((long)&pUVar1[-1].fUnion + 0x30);
    p = amPmsArray;
    if (lVar2 != 0) {
      lVar2 = lVar2 << 6;
      do {
        icu_63::UnicodeString::~UnicodeString
                  ((UnicodeString *)
                   ((long)&pUVar1[-1].super_Replaceable.super_UObject._vptr_UObject + lVar2));
        lVar2 = lVar2 + -0x40;
      } while (lVar2 != 0);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),p);
  }
  pUVar1 = newUnicodeStringArray((long)count);
  this->fAmPms = pUVar1;
  uprv_arrayCopy(amPmsArray,pUVar1,count);
  this->fAmPmsCount = count;
  return;
}

Assistant:

void
DateFormatSymbols::setAmPmStrings(const UnicodeString* amPmsArray, int32_t count)
{
    // delete the old list if we own it
    if (fAmPms) delete[] fAmPms;

    // we always own the new list, which we create here (we duplicate rather
    // than adopting the list passed in)
    fAmPms = newUnicodeStringArray(count);
    uprv_arrayCopy(amPmsArray,fAmPms,count);
    fAmPmsCount = count;
}